

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

IStreamingReporterPtr __thiscall
Catch::anon_unknown_1::createReporter(anon_unknown_1 *this,string *reporterName,IConfigPtr *config)

{
  int iVar1;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar2;
  undefined4 extraout_var;
  ReusableStringStream local_50;
  string local_38;
  
  pSVar2 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar1 = (*(pSVar2->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar2);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
            (this,(long *)CONCAT44(extraout_var,iVar1),reporterName,config);
  if (*(long *)this != 0) {
    return (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
            )(__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
              )this;
  }
  ReusableStringStream::ReusableStringStream(&local_50);
  std::operator<<((ostream *)local_50.m_oss,"No reporter registered with name: \'");
  std::operator<<((ostream *)local_50.m_oss,(string *)reporterName);
  std::operator<<((ostream *)local_50.m_oss,"\'");
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_38);
}

Assistant:

IStreamingReporterPtr createReporter(std::string const& reporterName, IConfigPtr const& config) {
            auto reporter = Catch::getRegistryHub().getReporterRegistry().create(reporterName, config);
            CATCH_ENFORCE(reporter, "No reporter registered with name: '" << reporterName << "'");

            return reporter;
        }